

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RandCaseItemSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RandCaseItemSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  StatementSyntax *node_00;
  size_t index_local;
  RandCaseItemSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    token.kind = (this->colon).kind;
    token._2_1_ = (this->colon).field_0x2;
    token.numFlags.raw = (this->colon).numFlags.raw;
    token.rawLen = (this->colon).rawLen;
    token.info = (this->colon).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 2) {
    node_00 = not_null<slang::syntax::StatementSyntax_*>::get(&this->statement);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RandCaseItemSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return expr.get();
        case 1: return colon;
        case 2: return statement.get();
        default: return nullptr;
    }
}